

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int fix_negative(mbedtls_mpi *N,char c,mbedtls_mpi *C,size_t bits)

{
  int iVar1;
  long lVar2;
  undefined7 in_register_00000031;
  long lVar3;
  
  lVar2 = (long)(int)CONCAT71(in_register_00000031,c);
  lVar3 = lVar2 << 0x20;
  if (bits != 0xe0) {
    lVar3 = lVar2;
  }
  C->p[C->n - 1] = -lVar3;
  iVar1 = mbedtls_mpi_sub_abs(N,C,N);
  if (iVar1 == 0) {
    N->s = -1;
  }
  return iVar1;
}

Assistant:

static inline int fix_negative( mbedtls_mpi *N, signed char c, mbedtls_mpi *C, size_t bits )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* C = - c * 2^(bits + 32) */
#if !defined(MBEDTLS_HAVE_INT64)
    ((void) bits);
#else
    if( bits == 224 )
        C->p[ C->n - 1 ] = ((mbedtls_mpi_uint) -c) << 32;
    else
#endif
        C->p[ C->n - 1 ] = (mbedtls_mpi_uint) -c;

    /* N = - ( C - N ) */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( N, C, N ) );
    N->s = -1;

cleanup:

    return( ret );
}